

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_for.hpp
# Opt level: O0

void Omega_h::
     for_each<Omega_h::IntIterator,Omega_h::coarsen_topology(Omega_h::Mesh*,Omega_h::Read<int>,int,Omega_h::Adj,Omega_h::Read<int>)::__0>
               (IntIterator first,IntIterator last,type *f)

{
  __0 local_c0 [8];
  type f2;
  type *f_local;
  IntIterator last_local;
  IntIterator first_local;
  
  _last_local = &f_local;
  if (first.i < last.i) {
    entering_parallel = 1;
    f2.old_verts2new_verts.write_.shared_alloc_.direct_ptr = f;
    f_local._0_4_ = last.i;
    f_local._4_4_ = first.i;
    coarsen_topology(Omega_h::Mesh*,Omega_h::Read<int>,int,Omega_h::Adj,Omega_h::Read<int>)::$_0::
    __0(local_c0,f);
    entering_parallel = 0;
    for (; f_local._4_4_ != f_local._0_4_; f_local._4_4_ = f_local._4_4_ + 1) {
      std::
      remove_reference<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_coarsen_topology.cpp:101:12)_&>
      ::type::operator()(local_c0,f_local._4_4_);
    }
    coarsen_topology(Omega_h::Mesh*,Omega_h::Read<int>,int,Omega_h::Adj,Omega_h::Read<int>)::$_0::
    ~__0(local_c0);
  }
  return;
}

Assistant:

void for_each(InputIterator first, InputIterator last, UnaryFunction&& f) {
  if (first >= last) return;
  Omega_h::entering_parallel = true;
  auto const f2 = std::move(f);
  Omega_h::entering_parallel = false;
#if defined(OMEGA_H_USE_OPENMP)
  LO const n = last - first;
#pragma omp parallel for
  for (LO i = 0; i < n; ++i) {
    f2(first[i]);
  }
#else
  for (; first != last; ++first) {
    f2(*first);
  }
#endif
}